

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void diff_ordset_free(ly_set *set)

{
  lys_node *__ptr;
  diff_ordered *ord;
  uint j;
  uint i;
  ly_set *set_local;
  
  if (set != (ly_set *)0x0) {
    for (ord._4_4_ = 0; ord._4_4_ < set->number; ord._4_4_ = ord._4_4_ + 1) {
      __ptr = (set->set).s[ord._4_4_];
      for (ord._0_4_ = 0; (uint)ord < *(uint *)&__ptr->ref; ord._0_4_ = (uint)ord + 1) {
        free(*(void **)(*(long *)&__ptr->flags + (ulong)(uint)ord * 0x18 + 0x10));
      }
      free(*(void **)&__ptr->flags);
      free(__ptr);
    }
    ly_set_free(set);
  }
  return;
}

Assistant:

static void
diff_ordset_free(struct ly_set *set)
{
    unsigned int i, j;
    struct diff_ordered *ord;

    if (!set) {
        return;
    }

    for (i = 0; i < set->number; i++) {
        ord = (struct diff_ordered *)set->set.g[i];
        for (j = 0; j < ord->count; j++) {
            free(ord->items[j].dist);
        }
        free(ord->items);
        free(ord);
    }

    ly_set_free(set);
}